

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void calculate_func_cfg_live_info(gen_ctx_t gen_ctx,int freq_p)

{
  func_cfg_t pfVar1;
  VARR_reg_info_t *pVVar2;
  undefined8 *puVar3;
  void *pvVar4;
  void *pvVar5;
  gen_ctx_t pgVar6;
  bitmap_t pVVar7;
  bb_t_conflict pbVar8;
  bool bVar9;
  byte bVar10;
  undefined4 uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  undefined8 *puVar16;
  ulong uVar17;
  reg_info_t *prVar18;
  MIR_item_t_conflict pMVar19;
  gen_ctx *pgVar20;
  MIR_context_t pMVar21;
  MIR_context_t pMVar22;
  code *pcVar23;
  int extraout_EDX;
  undefined1 *puVar24;
  HTAB_MIR_item_t *src2;
  ulong uVar25;
  uint uVar26;
  MIR_context_t pMVar27;
  MIR_context_t pMVar28;
  gen_ctx_t gen_ctx_00;
  MIR_module_t pMVar29;
  size_t sVar30;
  long lVar31;
  ulong uVar32;
  char *pcVar33;
  MIR_context_t pMVar34;
  gen_ctx *insn;
  void **ppvVar35;
  int out_p;
  MIR_reg_t early_clobbered_hard_reg1;
  MIR_context_t local_98;
  int local_8c;
  undefined1 local_6c [20];
  long local_58;
  MIR_context_t local_50;
  reg_info_t *local_48;
  bitmap_t local_40;
  int *local_38;
  
  gen_ctx->lr_ctx->ssa_live_info_p = 0;
  gen_ctx_00 = (gen_ctx_t)gen_ctx->ctx;
  pMVar28 = (MIR_context_t)gen_ctx->curr_func_item->module;
  puVar16 = (undefined8 *)
            _MIR_get_module_global_var_hard_regs
                      ((MIR_context_t)gen_ctx_00,(MIR_module_t_conflict)pMVar28);
  pfVar1 = gen_ctx->curr_cfg;
  pcVar23 = (code *)pfVar1->reg_info;
  pMVar21 = (MIR_context_t)pcVar23;
  if (((MIR_context_t)pcVar23 == (MIR_context_t)0x0) ||
     (((MIR_context_t)pcVar23)->error_func == (MIR_error_func_t)0x0)) goto LAB_0015bcd2;
  ((MIR_context_t)pcVar23)->gen_ctx = (gen_ctx *)0x0;
  uVar14 = pfVar1->max_var;
  uVar26 = 0;
  do {
    pVVar2 = gen_ctx->curr_cfg->reg_info;
    gen_ctx_00 = (gen_ctx_t)pVVar2->varr;
    if (gen_ctx_00 == (gen_ctx_t)0x0) goto LAB_0015bcaf;
    uVar17 = pVVar2->els_num + 1;
    if (pVVar2->size < uVar17) {
      sVar30 = (uVar17 >> 1) + uVar17;
      pMVar28 = (MIR_context_t)(sVar30 * 0x10);
      prVar18 = (reg_info_t *)realloc(gen_ctx_00,(size_t)pMVar28);
      pVVar2->varr = prVar18;
      pVVar2->size = sVar30;
    }
    sVar30 = pVVar2->els_num;
    pcVar23 = (code *)pVVar2->varr;
    pVVar2->els_num = sVar30 + 1;
    (&((MIR_context_t)pcVar23)->gen_ctx)[sVar30 * 2] = (gen_ctx *)0x0;
    (&((MIR_context_t)pcVar23)->gen_ctx + sVar30 * 2)[1] = (gen_ctx *)0x0;
    uVar26 = uVar26 + 1;
  } while (uVar26 <= uVar14);
  pMVar34 = (MIR_context_t)(gen_ctx->curr_cfg->bbs).head;
  pMVar21 = (MIR_context_t)pcVar23;
  pcVar23 = (code *)pMVar34;
  while ((MIR_context_t)pcVar23 != (MIR_context_t)0x0) {
    pMVar19 = (((MIR_context_t)pcVar23)->environment_module).items.tail;
    if ((((pMVar19 == (MIR_item_t_conflict)0x0) ||
         (pMVar28 = (MIR_context_t)(((MIR_context_t)pcVar23)->environment_module).module_link.prev,
         pMVar28 == (MIR_context_t)0x0)) ||
        (gen_ctx_00 = (gen_ctx_t)(((MIR_context_t)pcVar23)->environment_module).module_link.next,
        gen_ctx_00 == (gen_ctx_t)0x0)) ||
       (puVar3 = *(undefined8 **)&(((MIR_context_t)pcVar23)->environment_module).last_temp_item_num,
       puVar3 == (undefined8 *)0x0)) {
LAB_0015bc7c:
      __assert_fail("bb != ((void*)0) && bb->in != ((void*)0) && bb->out != ((void*)0) && bb->gen != ((void*)0) && bb->kill != ((void*)0)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x17bf,"void initiate_live_info(gen_ctx_t, int)");
    }
    if ((pMVar19->item_link).prev == (MIR_item_t)0x0) goto LAB_0015bcb4;
    pMVar19->data = (void *)0x0;
    if (((DLIST_MIR_item_t *)&pMVar28->error_func)->head == (MIR_item_t_conflict)0x0)
    goto LAB_0015bcb9;
    pMVar28->gen_ctx = (gen_ctx *)0x0;
    if (gen_ctx_00->curr_func_item == (MIR_item_t)0x0) goto LAB_0015bcbe;
    gen_ctx_00->ctx = (MIR_context_t)0x0;
    if (puVar3[2] == 0) goto LAB_0015bcc3;
    *puVar3 = 0;
    pMVar21 = (MIR_context_t)((MIR_context_t)pcVar23)->unspec_protos;
    pcVar23 = (code *)pMVar21;
  }
  if ((puVar16 == (undefined8 *)0x0) ||
     (pMVar21 = (MIR_context_t)gen_ctx->lr_ctx, *(MIR_reg_t *)((long)&pMVar21->gen_ctx + 4) != 0)) {
LAB_0015b297:
    insn = (gen_ctx *)(((gen_ctx->curr_func_item->u).func)->insns).tail;
    pcVar23 = (code *)pMVar21;
joined_r0x0015b2a6:
    if (insn != (gen_ctx *)0x0) {
      if (gen_ctx->optimize_level == 0) {
        uVar14 = *(int *)&insn->debug_file - 0xa7;
        pcVar23 = (code *)(ulong)uVar14;
        pgVar20 = insn;
        if ((uVar14 < 0xe) && ((0x2007U >> (uVar14 & 0x1f) & 1) != 0)) {
          pgVar20 = (gen_ctx *)insn->ctx;
        }
      }
      else {
        pgVar20 = (gen_ctx *)&((gen_ctx *)insn->ctx)->addr_insn_p;
      }
      pMVar21 = pgVar20->ctx;
      gen_ctx_00 = (gen_ctx_t)gen_ctx->ctx;
      pMVar28 = (MIR_context_t)gen_ctx->curr_func_item->module;
      local_40 = (bitmap_t)
                 _MIR_get_module_global_var_hard_regs
                           ((MIR_context_t)gen_ctx_00,(MIR_module_t_conflict)pMVar28);
      pVVar2 = gen_ctx->curr_cfg->reg_info;
      if (pVVar2 == (VARR_reg_info_t *)0x0) goto LAB_0015bcc8;
      local_48 = pVVar2->varr;
      pMVar34 = (MIR_context_t)&DAT_00000001;
      if (((freq_p != 0) && (gen_ctx->optimize_level != 0)) &&
         (iVar12 = bb_loop_level((bb_t_conflict)pMVar21), iVar12 != 0)) {
        iVar12 = iVar12 + 1;
        pMVar34 = (MIR_context_t)&DAT_00000001;
        do {
          pcVar23 = (code *)((long)pMVar34 * 5);
          if ((long)pMVar34 < 0xfffffffffffffff) {
            pMVar34 = (MIR_context_t)pcVar23;
          }
          iVar12 = iVar12 + -1;
        } while (1 < iVar12);
      }
      (pMVar21->all_modules).head = (MIR_module_t_conflict)0x0;
      local_58 = 0x7fffffffffffffff - (long)pMVar34;
      local_8c = 0;
      local_98 = (MIR_context_t)0x0;
      iVar12 = 0;
      local_50 = pMVar34;
      do {
        if (gen_ctx->optimize_level == 0) {
          uVar14 = *(int *)&insn->debug_file - 0xa7;
          pcVar23 = (code *)(ulong)uVar14;
          pgVar20 = insn;
          if ((uVar14 < 0xe) && ((0x2007U >> (uVar14 & 0x1f) & 1) != 0)) {
            pgVar20 = (gen_ctx *)insn->ctx;
          }
        }
        else {
          pgVar20 = (gen_ctx *)&insn->ctx->temp_string;
        }
        if (pgVar20->ctx != pMVar21) break;
        if (*(int *)&insn->debug_file == 0xba) {
          gen_ctx->lr_ctx->ssa_live_info_p = 1;
          uVar14 = insn->addr_insn_p;
          pMVar34 = (MIR_context_t)(ulong)uVar14;
          uVar26 = var_to_scan_var(gen_ctx,uVar14);
          if ((int)uVar26 < 0) goto LAB_0015baeb;
          pMVar29 = (pMVar21->environment_module).module_link.next;
          if (pMVar29 != (MIR_module_t)0x0) {
            uVar17 = (ulong)uVar26;
            if (((uVar17 < (ulong)((long)pMVar29->data << 6)) &&
                (pMVar19 = (pMVar29->items).head, pvVar4 = (&pMVar19->data)[uVar26 >> 6],
                (&pMVar19->data)[uVar26 >> 6] = (void *)((ulong)pvVar4 & ~(1L << (uVar17 & 0x3f))),
                ((ulong)pvVar4 >> (uVar17 & 0x3f) & 1) != 0)) && (gen_ctx->optimize_level != 0)) {
              iVar13 = int_var_type_p(gen_ctx,uVar14);
              if (iVar13 == 0) {
                local_98 = (MIR_context_t)(ulong)((int)local_98 - 1);
              }
              else {
                iVar12 = iVar12 + -1;
              }
            }
            pVVar7 = *(bitmap_t *)&(pMVar21->environment_module).last_temp_item_num;
            bitmap_expand(pVVar7,uVar17 + 1);
            if (pVVar7 != (bitmap_t)0x0) {
              pcVar23 = (code *)(ulong)(uVar26 >> 6);
              pVVar7->varr[(long)pcVar23] = pVVar7->varr[(long)pcVar23] | 1L << (uVar17 & 0x3f);
              goto LAB_0015baeb;
            }
            goto LAB_0015bc72;
          }
          goto LAB_0015bc77;
        }
        if ((0xfffffffc < *(int *)&insn->debug_file - 0xaaU) &&
           (gen_ctx->lr_ctx->scan_vars_num == 0)) {
          pVVar7 = *(bitmap_t *)&(pMVar21->environment_module).last_temp_item_num;
          bitmap_ior(pVVar7,pVVar7,gen_ctx->call_used_hard_regs[0x12]);
          pMVar29 = (pMVar21->environment_module).module_link.next;
          pcVar23 = (code *)gen_ctx->call_used_hard_regs[0x12];
          if (local_40 == (bitmap_t)0x0) {
            bitmap_and_compl((bitmap_t)pMVar29,(bitmap_t)pMVar29,(bitmap_t)pcVar23);
          }
          else {
            bitmap_ior_and_compl((bitmap_t)pMVar29,local_40,(bitmap_t)pMVar29,(bitmap_t)pcVar23);
          }
        }
        uVar25 = (ulong)*(uint *)((long)&insn->debug_file + 4);
        local_38 = &insn->debug_level;
        local_6c._4_8_ = &insn->addr_insn_p;
        uVar17 = 0;
LAB_0015b4df:
        bVar9 = true;
        if (uVar17 < uVar25) {
          ppvVar35 = (void **)local_6c._4_8_ + uVar17 * 6;
          do {
            sVar30 = uVar17;
            pcVar23 = (code *)local_6c;
            MIR_insn_op_mode(gen_ctx->ctx,(MIR_insn_t_conflict)insn,sVar30,(int *)pcVar23);
            if ((local_6c._0_4_ != 0) && ((char)*(uint *)(ppvVar35 + -1) != '\v')) {
              if ((char)*(uint *)(ppvVar35 + -1) != '\x02') {
                __assert_fail("op_ref->mode == MIR_OP_VAR",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x4ff,
                              "int output_insn_var_iterator_next(gen_ctx_t, insn_var_iterator_t *, MIR_reg_t *, int *)"
                             );
              }
              pMVar34 = (MIR_context_t)(ulong)*(uint *)ppvVar35;
              bVar9 = false;
              break;
            }
            ppvVar35 = ppvVar35 + 6;
            uVar17 = sVar30 + 1;
          } while (uVar25 != sVar30 + 1);
          uVar17 = sVar30 + 1;
        }
        if (!bVar9) {
          uVar26 = (uint)pMVar34;
          uVar14 = var_to_scan_var(gen_ctx,uVar26);
          if (-1 < (int)uVar14) {
            pMVar29 = (pMVar21->environment_module).module_link.next;
            if (pMVar29 != (MIR_module_t)0x0) {
              uVar32 = (ulong)uVar14;
              if (((uVar32 < (ulong)((long)pMVar29->data << 6)) &&
                  (pMVar19 = (pMVar29->items).head, pvVar4 = (&pMVar19->data)[uVar14 >> 6],
                  (&pMVar19->data)[uVar14 >> 6] = (void *)((ulong)pvVar4 & ~(1L << (uVar32 & 0x3f)))
                  , ((ulong)pvVar4 >> (uVar32 & 0x3f) & 1) != 0)) && (gen_ctx->optimize_level != 0))
              {
                iVar13 = int_var_type_p(gen_ctx,uVar26);
                if (iVar13 == 0) {
                  local_98 = (MIR_context_t)(ulong)((int)local_98 - 1);
                }
                else {
                  iVar12 = iVar12 + -1;
                }
              }
              pVVar7 = *(bitmap_t *)&(pMVar21->environment_module).last_temp_item_num;
              bitmap_expand(pVVar7,uVar32 + 1);
              if (pVVar7 != (bitmap_t)0x0) {
                pcVar23 = (code *)(ulong)(uVar14 >> 6);
                pVVar7->varr[(long)pcVar23] = pVVar7->varr[(long)pcVar23] | 1L << (uVar32 & 0x3f);
                if ((freq_p != 0) && (0x21 < uVar26)) {
                  puVar24 = (undefined1 *)
                            ((long)&local_50->gen_ctx + local_48[(ulong)pMVar34 & 0xffffffff].freq);
                  pcVar23 = (code *)0x7fffffffffffffff;
                  if (local_58 <= local_48[(ulong)pMVar34 & 0xffffffff].freq) {
                    puVar24 = (undefined1 *)0x7fffffffffffffff;
                  }
                  local_48[(ulong)pMVar34 & 0xffffffff].freq = (long)puVar24;
                }
                goto LAB_0015b4df;
              }
              calculate_func_cfg_live_info_cold_8();
            }
            calculate_func_cfg_live_info_cold_9();
            goto LAB_0015bc6d;
          }
          goto LAB_0015b4df;
        }
        uVar25 = (ulong)*(uint *)((long)&insn->debug_file + 4);
        uVar17 = 0;
        pMVar28 = (MIR_context_t)0x0;
LAB_0015b659:
        bVar9 = true;
        pMVar22 = pMVar28;
        if (uVar17 < uVar25) {
          do {
            pcVar23 = (code *)local_6c;
            MIR_insn_op_mode(gen_ctx->ctx,(MIR_insn_t_conflict)insn,uVar17,(int *)pcVar23);
            if ((local_6c._0_4_ == 0) ||
               (pMVar28 = pMVar22, (char)local_38[(uVar17 * 6 + 1) * 2] == '\v')) {
              if (pMVar22 < (MIR_context_t)&DAT_00000002) {
                while (pcVar23 = (code *)pMVar22, (char)local_38[(uVar17 * 6 + 1) * 2] == '\v') {
                  pMVar34 = (MIR_context_t)
                            (ulong)(uint)local_38[uVar17 * 0xc +
                                                  (ulong)(pMVar22 != (MIR_context_t)0x0) + 8];
                  if (local_38[uVar17 * 0xc + (ulong)(pMVar22 != (MIR_context_t)0x0) + 8] !=
                      0xffffffff) goto LAB_0015b6f2;
                  if (pMVar22 != (MIR_context_t)0x0) goto LAB_0015b6de;
                  pMVar22 = (MIR_context_t)&DAT_00000001;
                }
                if ((char)local_38[(uVar17 * 6 + 1) * 2] == '\x02') {
                  pMVar28 = (MIR_context_t)0x0;
                  if (pMVar22 == (MIR_context_t)&DAT_00000001) goto LAB_0015b6e0;
                  pMVar34 = (MIR_context_t)(ulong)(uint)local_38[(uVar17 * 6 + 2) * 2];
LAB_0015b6f2:
                  pcVar23 = (code *)((long)&pMVar22->gen_ctx + 1);
                  bVar9 = false;
                  pMVar28 = (MIR_context_t)pcVar23;
                  break;
                }
              }
LAB_0015b6de:
              pMVar28 = (MIR_context_t)0x0;
            }
LAB_0015b6e0:
            uVar17 = uVar17 + 1;
            pMVar22 = pMVar28;
          } while (uVar17 != uVar25);
        }
        iVar13 = (int)local_98;
        if (!bVar9) {
          uVar26 = (uint)pMVar34;
          uVar14 = var_to_scan_var(gen_ctx,uVar26);
          if (-1 < (int)uVar14) {
            local_6c._4_8_ = (pMVar21->environment_module).module_link.next;
            uVar32 = (ulong)uVar14;
            bitmap_expand((bitmap_t)local_6c._4_8_,uVar32 + 1);
            if ((MIR_module_t)local_6c._4_8_ == (MIR_module_t)0x0) goto LAB_0015bc6d;
            pMVar19 = ((DLIST_MIR_item_t *)(local_6c._4_8_ + 0x10))->head;
            pcVar23 = (code *)(ulong)(uVar14 >> 6);
            pvVar4 = (&pMVar19->data)[(long)pcVar23];
            (&pMVar19->data)[(long)pcVar23] = (void *)((ulong)pvVar4 | 1L << (uVar32 & 0x3f));
            if ((((ulong)pvVar4 >> (uVar32 & 0x3f) & 1) == 0) && (gen_ctx->optimize_level != 0)) {
              iVar15 = int_var_type_p(gen_ctx,uVar26);
              pcVar23 = (code *)pMVar21;
              if (iVar15 == 0) {
                local_98 = (MIR_context_t)(ulong)(iVar13 + 1U);
                if (*(int *)((long)&(pMVar21->all_modules).head + 4) <= iVar13) {
                  *(uint *)((long)&(pMVar21->all_modules).head + 4) = iVar13 + 1U;
                }
              }
              else {
                iVar13 = iVar12 + 1;
                bVar9 = *(int *)&(pMVar21->all_modules).head <= iVar12;
                iVar12 = iVar13;
                if (bVar9) {
                  *(int *)&(pMVar21->all_modules).head = iVar13;
                }
              }
            }
            if ((freq_p != 0) && (0x21 < uVar26)) {
              puVar24 = (undefined1 *)
                        ((long)&local_50->gen_ctx + local_48[(ulong)pMVar34 & 0xffffffff].freq);
              pcVar23 = (code *)0x7fffffffffffffff;
              if (local_58 <= local_48[(ulong)pMVar34 & 0xffffffff].freq) {
                puVar24 = (undefined1 *)0x7fffffffffffffff;
              }
              local_48[(ulong)pMVar34 & 0xffffffff].freq = (long)puVar24;
            }
          }
          goto LAB_0015b659;
        }
        if (gen_ctx->lr_ctx->scan_vars_num == 0) {
          pMVar28 = (MIR_context_t)(local_6c + 0x10);
          gen_ctx_00 = insn;
          target_get_early_clobbered_hard_regs
                    ((MIR_insn_t)insn,(MIR_reg_t *)pMVar28,(MIR_reg_t *)(local_6c + 0xc));
          uVar11 = local_6c._16_4_;
          pMVar22 = (MIR_context_t)(ulong)(uint)local_6c._16_4_;
          if (pMVar22 != (MIR_context_t)0xffffffff) {
            if (gen_ctx->optimize_level != 0) {
              pMVar28 = pMVar22;
              gen_ctx_00 = gen_ctx;
              local_8c = int_var_type_p(gen_ctx,local_6c._16_4_);
              if (local_8c == 0) {
                uVar14 = iVar13 + 1;
                pcVar23 = (code *)local_98;
                local_98 = (MIR_context_t)(ulong)uVar14;
                if (*(int *)((long)&(pMVar21->all_modules).head + 4) <= iVar13) {
                  *(uint *)((long)&(pMVar21->all_modules).head + 4) = uVar14;
                }
              }
              else {
                iVar13 = iVar12 + 1;
                bVar9 = *(int *)&(pMVar21->all_modules).head <= iVar12;
                iVar12 = iVar13;
                if (bVar9) {
                  *(int *)&(pMVar21->all_modules).head = iVar13;
                }
              }
            }
            pMVar29 = (pMVar21->environment_module).module_link.next;
            if (pMVar29 != (MIR_module_t)0x0) {
              pcVar23 = (code *)((long)pMVar29->data << 6);
              if (pMVar22 < pcVar23) {
                bVar10 = (byte)uVar11 & 0x3f;
                ppvVar35 = &((pMVar29->items).head)->data + ((uint)uVar11 >> 6);
                *ppvVar35 = (void *)((ulong)*ppvVar35 &
                                    (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10));
                pcVar23 = (code *)pMVar22;
              }
              pgVar6 = *(gen_ctx_t *)&(pMVar21->environment_module).last_temp_item_num;
              pMVar28 = (MIR_context_t)((long)&pMVar22->gen_ctx + 1);
              gen_ctx_00 = pgVar6;
              bitmap_expand((bitmap_t)pgVar6,(size_t)pMVar28);
              if (pgVar6 != (gen_ctx_t)0x0) {
                pcVar23 = (code *)(ulong)((uint)uVar11 >> 6);
                ppvVar35 = &pgVar6->curr_func_item->data + (long)pcVar23;
                *ppvVar35 = (void *)((ulong)*ppvVar35 | 1L << ((ulong)pMVar22 & 0x3f));
                if (gen_ctx->optimize_level != 0) {
                  if (local_8c == 0) {
                    local_98 = (MIR_context_t)(ulong)((int)local_98 - 1);
                    local_8c = 0;
                  }
                  else {
                    iVar12 = iVar12 + -1;
                    local_8c = 1;
                  }
                }
                goto LAB_0015b952;
              }
              calculate_func_cfg_live_info_cold_11();
LAB_0015bca0:
              calculate_func_cfg_live_info_cold_14();
LAB_0015bca5:
              calculate_func_cfg_live_info_cold_13();
            }
            calculate_func_cfg_live_info_cold_12();
            goto LAB_0015bcaf;
          }
LAB_0015b952:
          uVar11 = local_6c._12_4_;
          pMVar22 = (MIR_context_t)(ulong)(uint)local_6c._12_4_;
          iVar13 = iVar12;
          if (pMVar22 != (MIR_context_t)0xffffffff) {
            pMVar27 = local_98;
            if (gen_ctx->optimize_level != 0) {
              pMVar28 = pMVar22;
              gen_ctx_00 = gen_ctx;
              local_8c = int_var_type_p(gen_ctx,local_6c._12_4_);
              if (local_8c == 0) {
                uVar14 = (int)local_98 + 1;
                pcVar23 = (code *)local_98;
                pMVar27 = (MIR_context_t)(ulong)uVar14;
                if (*(int *)((long)&(pMVar21->all_modules).head + 4) <= (int)local_98) {
                  *(uint *)((long)&(pMVar21->all_modules).head + 4) = uVar14;
                }
              }
              else {
                iVar13 = iVar12 + 1;
                if (*(int *)&(pMVar21->all_modules).head <= iVar12) {
                  *(int *)&(pMVar21->all_modules).head = iVar13;
                }
              }
            }
            local_98 = pMVar27;
            pMVar29 = (pMVar21->environment_module).module_link.next;
            if (pMVar29 == (MIR_module_t)0x0) goto LAB_0015bca0;
            pcVar23 = (code *)((long)pMVar29->data << 6);
            if (pMVar22 < pcVar23) {
              bVar10 = (byte)uVar11 & 0x3f;
              ppvVar35 = &((pMVar29->items).head)->data + ((uint)uVar11 >> 6);
              *ppvVar35 = (void *)((ulong)*ppvVar35 &
                                  (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10));
              pcVar23 = (code *)pMVar22;
            }
            pgVar6 = *(gen_ctx_t *)&(pMVar21->environment_module).last_temp_item_num;
            pMVar28 = (MIR_context_t)((long)&pMVar22->gen_ctx + 1);
            gen_ctx_00 = pgVar6;
            bitmap_expand((bitmap_t)pgVar6,(size_t)pMVar28);
            if (pgVar6 == (gen_ctx_t)0x0) goto LAB_0015bca5;
            ppvVar35 = &pgVar6->curr_func_item->data + ((uint)uVar11 >> 6);
            *ppvVar35 = (void *)((ulong)*ppvVar35 | 1L << ((ulong)pMVar22 & 0x3f));
            if (gen_ctx->optimize_level != 0) {
              if (local_8c == 0) {
                local_98 = (MIR_context_t)(ulong)((int)local_98 - 1);
                local_8c = 0;
              }
              else {
                local_8c = 1;
                iVar13 = iVar13 + -1;
              }
            }
          }
          pcVar23 = (code *)0xffffff56;
          iVar12 = iVar13;
          if (0xfffffffc < *(int *)&insn->debug_file - 0xaaU) {
            if (gen_ctx->optimize_level == 0) {
              src2 = (HTAB_MIR_item_t *)insn->ctx->c2mir_ctx;
              if (src2 == (HTAB_MIR_item_t *)0x0) goto LAB_0015baeb;
              pMVar29 = (pMVar21->environment_module).module_link.next;
            }
            else {
              pMVar29 = (pMVar21->environment_module).module_link.next;
              src2 = insn->ctx->module_item_tab;
            }
            bitmap_ior((bitmap_t)pMVar29,(bitmap_t)pMVar29,(bitmap_t)src2);
          }
        }
LAB_0015baeb:
        insn = *(gen_ctx **)&insn->optimize_level;
      } while (insn != (gen_ctx *)0x0);
      goto joined_r0x0015b2a6;
    }
    pcVar23 = live_con_func_n;
    pMVar28 = (MIR_context_t)0x0;
    gen_ctx_00 = gen_ctx;
    solve_dataflow(gen_ctx,0,live_con_func_0,live_con_func_n,live_trans_func);
    if (gen_ctx->optimize_level != 0) {
      pMVar21 = (MIR_context_t)0x0;
      for (pbVar8 = (gen_ctx->curr_cfg->bbs).head; pbVar8 != (bb_t_conflict)0x0;
          pbVar8 = (pbVar8->bb_link).next) {
        pVVar7 = pbVar8->out;
        if (pVVar7 == (bitmap_t)0x0) goto LAB_0015bccd;
        pMVar34 = (MIR_context_t)0x0;
        iVar12 = pbVar8->max_int_pressure;
        iVar13 = pbVar8->max_fp_pressure;
LAB_0015bb6b:
        pcVar23 = (code *)((ulong)pMVar34 >> 6);
        pMVar22 = (MIR_context_t)pVVar7->els_num;
        bVar9 = true;
        pMVar27 = pMVar34;
        if (pcVar23 < pMVar22) {
          gen_ctx_00 = (gen_ctx_t)pVVar7->varr;
          pMVar28 = (MIR_context_t)((long)pMVar22 << 6);
LAB_0015bb87:
          if (((MIR_item_t_conflict)
               gen_ctx_00->call_used_hard_regs
               [(long)((long)&((MIR_context_t)((long)pcVar23 + -0x118))->setjmp_addr + 3)] ==
               (MIR_item_t_conflict)0x0) ||
             (uVar17 = (ulong)gen_ctx_00->call_used_hard_regs
                              [(long)((long)&((MIR_context_t)((long)pcVar23 + -0x118))->setjmp_addr
                                     + 3)] >> ((ulong)pMVar34 & 0x3f), uVar17 == 0))
          goto LAB_0015bb9a;
          uVar25 = uVar17 & 1;
          pMVar21 = pMVar34;
          while (uVar25 == 0) {
            pMVar21 = (MIR_context_t)((long)&pMVar21->gen_ctx + 1);
            uVar25 = uVar17 & 2;
            uVar17 = uVar17 >> 1;
          }
          bVar9 = false;
          pMVar27 = (MIR_context_t)((long)&pMVar21->gen_ctx + 1);
        }
LAB_0015bbce:
        if (!bVar9) {
          pMVar28 = (MIR_context_t)((ulong)pMVar21 & 0xffffffff);
          gen_ctx_00 = gen_ctx;
          iVar15 = int_var_type_p(gen_ctx,(MIR_reg_t)pMVar21);
          pMVar34 = pMVar27;
          if (iVar15 == 0) {
            iVar15 = iVar13 + 1;
            bVar9 = pbVar8->max_fp_pressure <= iVar13;
            iVar13 = iVar15;
            if (bVar9) {
              pbVar8->max_fp_pressure = iVar15;
            }
          }
          else {
            iVar15 = iVar12 + 1;
            bVar9 = pbVar8->max_int_pressure <= iVar12;
            iVar12 = iVar15;
            if (bVar9) {
              pbVar8->max_int_pressure = iVar15;
            }
          }
          goto LAB_0015bb6b;
        }
      }
    }
    return;
  }
  if (pMVar34 != (MIR_context_t)0x0) {
    pMVar34 = (MIR_context_t)pMVar34->unspec_protos;
  }
  pMVar29 = (pMVar34->environment_module).module_link.prev;
  if (pMVar29 != (MIR_module_t)0x0) {
    pvVar4 = pMVar29->data;
    pvVar5 = (void *)*puVar16;
    if (pvVar4 < pvVar5) {
      pMVar21 = (MIR_context_t)CONCAT71((int7)((ulong)pMVar21 >> 8),0x3a);
      lVar31 = (long)((ulong)pvVar5 & 0x3ffffffffffffff) - (long)pvVar4;
      if (pvVar4 <= (void *)((ulong)pvVar5 & 0x3ffffffffffffff) && lVar31 != 0) {
        do {
          gen_ctx_00 = (gen_ctx_t)(pMVar29->items).head;
          if (gen_ctx_00 == (gen_ctx_t)0x0) goto LAB_0015bcd7;
          uVar17 = (long)pMVar29->data + 1;
          if (pMVar29->name < uVar17) {
            pcVar33 = (char *)(uVar17 + (uVar17 >> 1));
            pMVar28 = (MIR_context_t)((long)pcVar33 * 8);
            pMVar19 = (MIR_item_t_conflict)realloc(gen_ctx_00,(size_t)pMVar28);
            (pMVar29->items).head = pMVar19;
            pMVar29->name = pcVar33;
          }
          pvVar4 = pMVar29->data;
          pMVar21 = (MIR_context_t)(pMVar29->items).head;
          pMVar29->data = (void *)((long)pvVar4 + 1);
          (&pMVar21->gen_ctx)[(long)pvVar4] = (gen_ctx *)0x0;
          lVar31 = lVar31 + -1;
        } while (lVar31 != 0);
      }
    }
    else {
      if ((pMVar29->items).head == (MIR_item_t_conflict)0x0) goto LAB_0015bce1;
      pMVar29->data = pvVar5;
    }
    memcpy((pMVar29->items).head,(void *)puVar16[2],(long)pvVar5 << 3);
    goto LAB_0015b297;
  }
  goto LAB_0015bcdc;
LAB_0015bc6d:
  calculate_func_cfg_live_info_cold_10();
LAB_0015bc72:
  calculate_func_cfg_live_info_cold_15();
LAB_0015bc77:
  calculate_func_cfg_live_info_cold_16();
  goto LAB_0015bc7c;
LAB_0015bb9a:
  pcVar23 = (code *)((long)&((MIR_context_t)pcVar23)->gen_ctx + 1);
  pMVar34 = (MIR_context_t)((long)pcVar23 * 0x40);
  pMVar27 = pMVar28;
  if (pMVar22 == (MIR_context_t)pcVar23) goto LAB_0015bbce;
  goto LAB_0015bb87;
LAB_0015bcaf:
  calculate_func_cfg_live_info_cold_19();
LAB_0015bcb4:
  calculate_func_cfg_live_info_cold_4();
LAB_0015bcb9:
  calculate_func_cfg_live_info_cold_3();
LAB_0015bcbe:
  calculate_func_cfg_live_info_cold_2();
LAB_0015bcc3:
  calculate_func_cfg_live_info_cold_1();
LAB_0015bcc8:
  calculate_func_cfg_live_info_cold_17();
LAB_0015bccd:
  calculate_func_cfg_live_info_cold_18();
  pMVar21 = (MIR_context_t)pcVar23;
LAB_0015bcd2:
  calculate_func_cfg_live_info_cold_20();
LAB_0015bcd7:
  calculate_func_cfg_live_info_cold_6();
LAB_0015bcdc:
  calculate_func_cfg_live_info_cold_7();
LAB_0015bce1:
  iVar12 = (int)pMVar21;
  calculate_func_cfg_live_info_cold_5();
  if ((gen_ctx_00->debug_file != (FILE *)0x0) && (1 < gen_ctx_00->debug_level)) {
    if (extraout_EDX != 0) {
      add_bb_insn_dead_vars(gen_ctx_00);
    }
    iVar13 = 0x1ba8bd;
    fprintf((FILE *)gen_ctx_00->debug_file,"+++++++++++++%s:\n",pMVar28);
    print_loop_tree(gen_ctx_00,iVar13);
    print_CFG(gen_ctx_00,1,iVar12,1,1,output_bb_live_info);
    return;
  }
  return;
}

Assistant:

static void calculate_func_cfg_live_info (gen_ctx_t gen_ctx, int freq_p) {
  ssa_live_info_p = FALSE;
  initiate_live_info (gen_ctx, freq_p);
  solve_dataflow (gen_ctx, FALSE, live_con_func_0, live_con_func_n, live_trans_func);
  if (optimize_level != 0) update_bb_pressure (gen_ctx);
}